

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::Value::setSize(Value *this,size_t size)

{
  Value *pVVar1;
  Ref *pRVar2;
  size_t i;
  ulong index;
  
  if (this->type != Array) {
    __assert_fail("isArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x1a0,"void cashew::Value::setSize(size_t)");
  }
  index = (((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
          usedElements;
  if (index != size) {
    ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::resize
              (&((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>,size
              );
  }
  if (index < size) {
    for (; index < size; index = index + 1) {
      pVVar1 = GlobalMixedArena::alloc<cashew::Value>((GlobalMixedArena *)&arena);
      pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[]
                         (&((this->field_1).arr)->
                           super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>,index);
      pRVar2->inst = pVVar1;
    }
  }
  return;
}

Assistant:

void setSize(size_t size) {
    assert(isArray());
    auto old = arr->size();
    if (old != size) {
      arr->resize(size);
    }
    if (old < size) {
      for (auto i = old; i < size; i++) {
        (*arr)[i] = arena.alloc<Value>();
      }
    }
  }